

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode::~SectionNode(SectionNode *this)

{
  ~SectionNode(this);
  operator_delete(this,0xf8);
  return;
}

Assistant:

virtual ~SectionNode() = default;